

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::paintEvent(QMenu *this,QPaintEvent *e)

{
  undefined8 *puVar1;
  short sVar2;
  int iVar3;
  QMenuPrivate *this_00;
  QWidgetData *pQVar4;
  QWidget *pQVar5;
  Data *this_01;
  bool bVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  QStyle *pQVar16;
  Node<QAction_*,_QWidget_*> *pNVar17;
  QPalette *pQVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  State SVar22;
  long lVar23;
  ScrollerTearOffItem *this_02;
  long in_FS_OFFSET;
  QRegion adjustedActionReg;
  QRegion borderReg;
  QAction *action;
  QRegion emptyArea;
  QStyleOptionMenuItem opt;
  QRegion local_210;
  undefined8 local_208;
  Representation RStack_200;
  Representation RStack_1fc;
  QRect local_1f8;
  QAction *local_1e0;
  QRect local_1d8;
  QRect local_1c8;
  QRect local_1b8;
  QRect local_1a8;
  QRegion local_190;
  QRegion local_188;
  QMenu *pQStack_180;
  QStyle *local_178;
  undefined1 local_168 [12];
  State SStack_15c;
  QRegionData *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  undefined1 auStack_140 [16];
  QObject *pQStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  QArrayData *local_108;
  QIcon local_f0 [2];
  QFont local_e0 [16];
  undefined1 local_d0 [128];
  undefined8 local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  local_d0._0_16_ = (undefined1  [16])QMenuPrivate::popupGeometry(this_00,(QScreen *)0x0);
  QMenuPrivate::updateActionRects(this_00,(QRect *)local_d0);
  local_178 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_188.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_180 = (QMenu *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_188);
  pQStack_180 = this;
  local_178 = QWidget::style(&this->super_QWidget);
  QPainter::begin((QPaintDevice *)&local_188);
  QPainter::setRenderHint((RenderHint)(QPainter *)&local_188,true);
  local_190.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (this->super_QWidget).data;
  auVar7._4_4_ = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
  auVar7._0_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  auVar7._8_8_ = 0;
  local_d0._0_16_ = auVar7 << 0x40;
  QRegion::QRegion(&local_190,(QRect *)local_d0,Rectangle);
  memset((QStyleOptionMenuItem *)local_d0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_d0);
  QStyleOption::initFrom((QStyleOption *)local_d0,&this->super_QWidget);
  local_d0._8_4_ = 0;
  local_d0._68_4_ = 0;
  local_50._0_4_ = 0;
  local_50._4_4_ = 0;
  (**(code **)(*(long *)local_178 + 0xb0))
            (local_178,0x30,(QStyleOptionMenuItem *)local_d0,(QPainter *)&local_188,pQStack_180);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar10 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1e,0,this);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1c,0,this);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar12 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1d,0,this);
  local_1a8.x1.m_i = 0;
  local_1a8.y1.m_i = 0;
  local_1a8.x2.m_i = -1;
  local_1a8.y2.m_i = -1;
  local_1b8.x1.m_i = 0;
  local_1b8.y1.m_i = 0;
  local_1b8.x2.m_i = -1;
  local_1b8.y2.m_i = -1;
  iVar13 = (int)(this_00->super_QWidgetPrivate).leftmargin;
  iVar15 = iVar11 + iVar10 + iVar13;
  iVar19 = (int)(this_00->super_QWidgetPrivate).topmargin + iVar12 + iVar10;
  pQVar4 = (this->super_QWidget).data;
  iVar11 = (((pQVar4->crect).x2.m_i + (iVar11 + iVar10) * -2) -
           (iVar13 + (pQVar4->crect).x1.m_i + (int)(this_00->super_QWidgetPrivate).rightmargin)) + 1
  ;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    sVar2 = (this_00->super_QWidgetPrivate).bottommargin;
    bVar8 = this_00->scroll->scrollFlags;
    if ((bVar8 & 1) != 0) {
      pQVar5 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar16 = QWidget::style(pQVar5);
      iVar13 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar5);
      local_1a8.x2.m_i = iVar15 + -1 + iVar11;
      local_1a8.y2.m_i = iVar13 + iVar19 + -1;
      bVar8 = this_00->scroll->scrollFlags;
      local_1a8.x1.m_i = iVar15;
      local_1a8.y1.m_i = iVar19;
    }
    if ((bVar8 & 2) != 0) {
      pQVar4 = (this->super_QWidget).data;
      iVar13 = (pQVar4->crect).y2.m_i;
      pQVar5 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      iVar3 = (pQVar4->crect).y1.m_i;
      pQVar16 = QWidget::style(pQVar5);
      iVar14 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar5);
      iVar14 = iVar14 + iVar12 + iVar10 + (int)sVar2 + iVar3;
      pQVar5 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar16 = QWidget::style(pQVar5);
      iVar12 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar5);
      local_1b8.x2.m_i = iVar15 + iVar11 + -1;
      local_1b8.y2.m_i = iVar12 + (iVar13 - iVar14);
      local_1b8.x1.m_i = iVar15;
      local_1b8.y1.m_i = (iVar13 - iVar14) + 1;
    }
  }
  local_1c8.x1.m_i = 0;
  local_1c8.y1.m_i = 0;
  local_1c8.x2.m_i = -1;
  local_1c8.y2.m_i = -1;
  if ((this_00->field_0x421 & 2) != 0) {
    pQVar16 = QWidget::style(&this->super_QWidget);
    iVar12 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1f,0,this);
    local_1c8.x2.m_i = iVar15 + -1 + iVar11;
    local_1c8.y2.m_i = iVar12 + iVar19 + -1;
    local_1c8.x1.m_i = iVar15;
    local_1c8.y1.m_i = iVar19;
    if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 1) != 0)) {
      pQVar5 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar16 = QWidget::style(pQVar5);
      iVar15 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar5);
      local_1c8.y1.m_i = local_1c8.y1.m_i + iVar15;
      local_1c8.y2.m_i = local_1c8.y2.m_i + iVar15;
    }
  }
  local_1d8 = (QRect)QRect::operator|(&local_1a8,&local_1c8);
  if ((this_00->super_QWidgetPrivate).actions.d.size != 0) {
    lVar23 = 0;
    uVar21 = 0;
    do {
      local_1e0 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar21];
      puVar1 = (undefined8 *)((long)&(((this_00->actionRects).d.ptr)->x1).m_i + lVar23);
      local_1f8._0_8_ = *puVar1;
      local_1f8._8_8_ = puVar1[1];
      cVar9 = QRect::intersects((QRect *)(e + 0x10));
      if (cVar9 != '\0') {
        this_01 = (this_00->widgetItems).d;
        if (this_01 != (Data *)0x0) {
          pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                              ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)this_01,&local_1e0);
          if ((pNVar17 != (Node<QAction_*,_QWidget_*> *)0x0) && (pNVar17->value != (QWidget *)0x0))
          goto LAB_0045c378;
        }
        QRegion::QRegion((QRegion *)local_168,&local_1f8,Rectangle);
        QRegion::operator-=(&local_190,(QRegion *)local_168);
        QRegion::~QRegion((QRegion *)local_168);
        local_208 = (QRegionData *)local_1f8._0_8_;
        RStack_200.m_i = local_1f8.x2.m_i;
        RStack_1fc.m_i = local_1f8.y2.m_i;
        if (local_1d8.x1.m_i <= local_1d8.x2.m_i) {
          if ((local_1d8.y1.m_i <= local_1d8.y2.m_i) &&
             (RStack_1fc.m_i = local_1f8.y2.m_i, bVar6 = RStack_1fc.m_i <= local_1d8.y1.m_i, bVar6))
          goto LAB_0045c378;
        }
        if ((local_1b8.x2.m_i < local_1b8.x1.m_i) ||
           ((local_1b8.y2.m_i < local_1b8.y1.m_i ||
            (local_208._4_4_ = local_1f8.y1.m_i, bVar6 = local_208._4_4_ < local_1b8.y2.m_i, bVar6))
           )) {
          cVar9 = QRect::intersects((QRect *)&local_208);
          if (cVar9 != '\0') {
            if (RStack_1fc.m_i <= local_1d8.y2.m_i) goto LAB_0045c378;
            local_208 = (QRegionData *)CONCAT44(local_1d8.y2.m_i + 1,local_208._0_4_);
          }
          cVar9 = QRect::intersects((QRect *)&local_208);
          if (cVar9 != '\0') {
            if (local_1b8.y1.m_i <= local_208._4_4_) goto LAB_0045c378;
            RStack_1fc.m_i = local_1b8.y1.m_i + -1;
          }
          local_210.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&local_210,(QRect *)&local_208,Rectangle);
          QPainter::setClipRegion(&local_188,(ClipOperation)&local_210);
          memset((QStyleOptionMenuItem *)local_168,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_168);
          (**(code **)(*(long *)&this->super_QWidget + 0x1a0))
                    (this,(QStyleOptionMenuItem *)local_168,local_1e0);
          local_158 = (QRegionData *)local_1f8._0_8_;
          puStack_150._0_4_ = local_1f8.x2.m_i;
          puStack_150._4_4_ = local_1f8.y2.m_i;
          (**(code **)(*(long *)local_178 + 0xb8))
                    (local_178,0xe,(QStyleOptionMenuItem *)local_168,&local_188,pQStack_180);
          QFont::~QFont(local_e0);
          QIcon::~QIcon(local_f0);
          if (local_108 != (QArrayData *)0x0) {
            LOCK();
            (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_108,2,0x10);
            }
          }
          QStyleOption::~QStyleOption((QStyleOption *)local_168);
          QRegion::~QRegion(&local_210);
        }
      }
LAB_0045c378:
      uVar21 = uVar21 + 1;
      lVar23 = lVar23 + 0x10;
    } while (uVar21 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
  }
  QRegion::QRegion((QRegion *)local_168,&local_1d8,Rectangle);
  QRegion::operator-=(&local_190,(QRegion *)local_168);
  QRegion::~QRegion((QRegion *)local_168);
  QRegion::QRegion((QRegion *)local_168,&local_1b8,Rectangle);
  QRegion::operator-=(&local_190,(QRegion *)local_168);
  QRegion::~QRegion((QRegion *)local_168);
  if (this_00->scrollUpTearOffItem == (ScrollerTearOffItem *)0x0) {
    this_02 = this_00->scrollDownItem;
    if (this_02 == (ScrollerTearOffItem *)0x0) {
      QMenuPrivate::drawScroller(this_00,(QPainter *)&local_188,ScrollUp,&local_1a8);
      QMenuPrivate::drawScroller(this_00,(QPainter *)&local_188,ScrollDown,&local_1b8);
      QMenuPrivate::drawTearOff(this_00,(QPainter *)&local_188,&local_1c8);
      goto LAB_0045c43e;
    }
  }
  else {
    QMenuPrivate::ScrollerTearOffItem::updateScrollerRects(this_00->scrollUpTearOffItem,&local_1d8);
    this_02 = this_00->scrollDownItem;
    if (this_02 == (ScrollerTearOffItem *)0x0) goto LAB_0045c43e;
  }
  QMenuPrivate::ScrollerTearOffItem::updateScrollerRects(this_02,&local_1b8);
LAB_0045c43e:
  if (iVar10 != 0) {
    local_1f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)&local_1f8);
    pQVar4 = (this->super_QWidget).data;
    local_168._0_8_ = (QRegionData *)0x0;
    SVar22.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i
         = (QFlagsStorageHelper<QStyle::StateFlag,_4>)(iVar10 + -1);
    SStack_15c.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i);
    local_168._8_4_ =
         SVar22.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i;
    QRegion::operator+=((QRegion *)&local_1f8,(QRect *)local_168);
    pQVar4 = (this->super_QWidget).data;
    local_168._0_4_ = ((pQVar4->crect).x2.m_i - ((pQVar4->crect).x1.m_i + iVar10)) + 1;
    local_168._4_4_ = 0;
    SStack_15c.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i);
    local_168._8_4_ =
         local_168._0_4_ +
         (int)SVar22.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
    QRegion::operator+=((QRegion *)&local_1f8,(QRect *)local_168);
    pQVar4 = (this->super_QWidget).data;
    local_168._0_8_ = (QRegionData *)0x0;
    SStack_15c.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         SVar22.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i;
    local_168._8_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
    QRegion::operator+=((QRegion *)&local_1f8,(QRect *)local_168);
    pQVar4 = (this->super_QWidget).data;
    uVar20 = ((pQVar4->crect).y2.m_i - ((pQVar4->crect).y1.m_i + iVar10)) + 1;
    local_168._0_8_ = (ulong)uVar20 << 0x20;
    SStack_15c.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((int)SVar22.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i + uVar20);
    local_168._8_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
    QRegion::operator+=((QRegion *)&local_1f8,(QRect *)local_168);
    QPainter::setClipRegion(&local_188,(ClipOperation)(QRegion *)&local_1f8);
    QRegion::operator-=(&local_190,(QRegion *)&local_1f8);
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    auStack_140._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    auStack_140._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
    local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffea0 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_168);
    pQVar4 = (this->super_QWidget).data;
    puStack_150._0_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
    puStack_150._4_4_ = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
    local_158 = (QRegionData *)0x0;
    pQVar18 = QWidget::palette(&this->super_QWidget);
    QPalette::operator=((QPalette *)auStack_140,pQVar18);
    stack0xfffffffffffffea0 = (undefined1 *)((ulong)stack0xfffffffffffffea0 & 0xffffffff00000000);
    pQVar16 = QWidget::style(&this->super_QWidget);
    uVar20 = (**(code **)(*(long *)pQVar16 + 0xe0))
                       (pQVar16,0x1e,(QStyleOptionFrame *)local_168,this);
    local_128 = (undefined1 *)(ulong)uVar20;
    (**(code **)(*(long *)local_178 + 0xb0))
              (local_178,6,(QStyleOptionFrame *)local_168,&local_188,pQStack_180);
    QStyleOption::~QStyleOption((QStyleOption *)local_168);
    QRegion::~QRegion((QRegion *)&local_1f8);
  }
  QPainter::setClipRegion(&local_188,(ClipOperation)&local_190);
  local_d0._8_4_ = 0;
  local_d0._64_4_ = EmptyArea;
  local_d0._68_4_ = NotCheckable;
  pQVar4 = (this->super_QWidget).data;
  iVar15 = (pQVar4->crect).y2.m_i;
  local_d0._24_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  local_d0._28_4_ = iVar15 - (pQVar4->crect).y1.m_i;
  local_d0._16_4_ = 0;
  local_d0._20_4_ = 0;
  local_d0._84_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  local_d0._88_4_ = iVar15 - (pQVar4->crect).y1.m_i;
  local_d0._76_4_ = 0;
  local_d0._80_4_ = 0;
  (**(code **)(*(long *)local_178 + 0xb8))(local_178,0x13,(QRect *)local_d0,&local_188,pQStack_180);
  QFont::~QFont((QFont *)&local_48);
  QIcon::~QIcon((QIcon *)(local_d0 + 0x78));
  if ((QArrayData *)local_d0._96_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d0._96_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d0._96_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d0._96_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d0._96_8_,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_d0);
  QRegion::~QRegion(&local_190);
  QPainter::~QPainter((QPainter *)&local_188);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::paintEvent(QPaintEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    QStylePainter p(this);
    QRegion emptyArea = QRegion(rect());

    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(this);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    p.drawPrimitive(QStyle::PE_PanelMenu, menuOpt);

    //calculate the scroll up / down rect
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_MenuHMargin,nullptr, this);
    const int vmargin = style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, this);

    QRect scrollUpRect, scrollDownRect;
    const int leftmargin = fw + hmargin + d->leftmargin;
    const int topmargin = fw + vmargin + d->topmargin;
    const int bottommargin = fw + vmargin + d->bottommargin;
    const int contentWidth = width() - (fw + hmargin) * 2 - d->leftmargin - d->rightmargin;
    if (d->scroll) {
        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            scrollUpRect.setRect(leftmargin, topmargin, contentWidth, d->scrollerHeight());

        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
            scrollDownRect.setRect(leftmargin, height() - d->scrollerHeight() - bottommargin,
                                   contentWidth, d->scrollerHeight());
    }

    //calculate the tear off rect
    QRect tearOffRect;
    if (d->tearoff) {
        tearOffRect.setRect(leftmargin, topmargin, contentWidth,
                            style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this));
        if (d->scroll && d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearOffRect.translate(0, d->scrollerHeight());
    }

    //draw the items that need updating..
    QRect scrollUpTearOffRect = scrollUpRect.united(tearOffRect);
    for (int i = 0; i < d->actions.size(); ++i) {
        QAction *action = d->actions.at(i);
        QRect actionRect = d->actionRects.at(i);
        if (!e->rect().intersects(actionRect)
            || d->widgetItems.value(action))
           continue;
        //set the clip region to be extra safe (and adjust for the scrollers)
        emptyArea -= QRegion(actionRect);

        QRect adjustedActionRect = actionRect;
        if (!scrollUpTearOffRect.isEmpty() && adjustedActionRect.bottom() <= scrollUpTearOffRect.top())
            continue;

        if (!scrollDownRect.isEmpty() && adjustedActionRect.top() >=  scrollDownRect.bottom())
            continue;

        if (adjustedActionRect.intersects(scrollUpTearOffRect)) {
            if (adjustedActionRect.bottom() <= scrollUpTearOffRect.bottom())
                continue;
            else
                adjustedActionRect.setTop(scrollUpTearOffRect.bottom()+1);
        }

        if (adjustedActionRect.intersects(scrollDownRect)) {
            if (adjustedActionRect.top() >= scrollDownRect.top())
                continue;
            else
                adjustedActionRect.setBottom(scrollDownRect.top()-1);
        }

        QRegion adjustedActionReg(adjustedActionRect);
        p.setClipRegion(adjustedActionReg);

        QStyleOptionMenuItem opt;
        initStyleOption(&opt, action);
        opt.rect = actionRect;
        p.drawControl(QStyle::CE_MenuItem, opt);
    }

    emptyArea -= QRegion(scrollUpTearOffRect);
    emptyArea -= QRegion(scrollDownRect);

    if (d->scrollUpTearOffItem || d->scrollDownItem) {
        if (d->scrollUpTearOffItem)
            d->scrollUpTearOffItem->updateScrollerRects(scrollUpTearOffRect);
        if (d->scrollDownItem)
            d->scrollDownItem->updateScrollerRects(scrollDownRect);
    } else {
        //paint scroll up /down
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollUp, scrollUpRect);
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollDown, scrollDownRect);
        //paint the tear off..
        d->drawTearOff(&p, tearOffRect);
    }

    //draw border
    if (fw) {
        QRegion borderReg;
        borderReg += QRect(0, 0, fw, height()); //left
        borderReg += QRect(width()-fw, 0, fw, height()); //right
        borderReg += QRect(0, 0, width(), fw); //top
        borderReg += QRect(0, height()-fw, width(), fw); //bottom
        p.setClipRegion(borderReg);
        emptyArea -= borderReg;
        QStyleOptionFrame frame;
        frame.rect = rect();
        frame.palette = palette();
        frame.state = QStyle::State_None;
        frame.lineWidth = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &frame, this);
        frame.midLineWidth = 0;
        p.drawPrimitive(QStyle::PE_FrameMenu, frame);
    }

    //finally the rest of the spaces
    p.setClipRegion(emptyArea);
    menuOpt.state = QStyle::State_None;
    menuOpt.menuItemType = QStyleOptionMenuItem::EmptyArea;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.rect = rect();
    menuOpt.menuRect = rect();
    p.drawControl(QStyle::CE_MenuEmptyArea, menuOpt);
}